

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void pcut_print_items(pcut_item_t *first)

{
  pcut_item_t *local_18;
  pcut_item_t *it;
  pcut_item_t *first_local;
  
  printf("====>\n");
  for (local_18 = first; local_18 != (pcut_item_t *)0x0; local_18 = local_18->next) {
    switch(local_18->kind) {
    case 0:
      break;
    case 1:
      printf("NESTED ...\n");
      break;
    default:
      printf("UNKNOWN (%d)\n",(ulong)(uint)local_18->kind);
      break;
    case 4:
      printf("SUITE %s\n",local_18->name);
      break;
    case 5:
      printf("TEST %s\n",local_18->name);
    }
  }
  printf("----\n");
  return;
}

Assistant:

void pcut_print_items(pcut_item_t *first) {
	pcut_item_t *it = first;
	printf("====>\n");
	while (it != NULL) {
		switch (it->kind) {
		case PCUT_KIND_TEST:
			printf("TEST %s\n", it->name);
			break;
		case PCUT_KIND_TESTSUITE:
			printf("SUITE %s\n", it->name);
			break;
		case PCUT_KIND_SKIP:
			break;
		case PCUT_KIND_NESTED:
			printf("NESTED ...\n");
			break;
		default:
			printf("UNKNOWN (%d)\n", it->kind);
			break;
		}
		it = it->next;
	}
	printf("----\n");
}